

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTableWidgetSelectionRange>::moveAppend
          (QGenericArrayOps<QTableWidgetSelectionRange> *this,QTableWidgetSelectionRange *b,
          QTableWidgetSelectionRange *e)

{
  qsizetype *pqVar1;
  QTableWidgetSelectionRange *pQVar2;
  QTableWidgetSelectionRange *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (b != e) {
    pQVar3 = (this->super_QArrayDataPointer<QTableWidgetSelectionRange>).ptr;
    for (; b < e; b = b + 1) {
      iVar4 = b->m_left;
      iVar5 = b->m_bottom;
      iVar6 = b->m_right;
      pQVar2 = pQVar3 + (this->super_QArrayDataPointer<QTableWidgetSelectionRange>).size;
      pQVar2->m_top = b->m_top;
      pQVar2->m_left = iVar4;
      pQVar2->m_bottom = iVar5;
      pQVar2->m_right = iVar6;
      pqVar1 = &(this->super_QArrayDataPointer<QTableWidgetSelectionRange>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }